

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.tab.cpp
# Opt level: O0

void FlatZinc::solve(istream *is,ostream *err)

{
  ParserState *this;
  ParserState pp;
  string s;
  void *in_stack_00003830;
  yyscan_t *in_stack_fffffffffffffc08;
  istreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffc10;
  istream_type *in_stack_fffffffffffffc18;
  string *b;
  ParserState *in_stack_fffffffffffffc20;
  allocator<char> *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffc58;
  istreambuf_iterator<char,_std::char_traits<char>_> in_stack_fffffffffffffc68;
  FlatZincSpace *in_stack_fffffffffffffce0;
  ParserState *in_stack_fffffffffffffd20;
  byte local_78;
  string local_51;
  string local_30 [48];
  
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc20,
             in_stack_fffffffffffffc18);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            (in_stack_fffffffffffffc10);
  b = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc68,in_stack_fffffffffffffc58,
             in_stack_fffffffffffffc48);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  ParserState::ParserState(in_stack_fffffffffffffc20,b,(ostream *)in_stack_fffffffffffffc10);
  yylex_init(in_stack_fffffffffffffc08);
  yyset_extra(&stack0xfffffffffffffc20,in_stack_fffffffffffffc20);
  yyparse(in_stack_00003830);
  this = (ParserState *)ParserState::getOutput(in_stack_fffffffffffffd20);
  *(ParserState **)(FlatZinc::s + 0x90) = this;
  FlatZincSpace::setOutput(in_stack_fffffffffffffce0);
  if (in_stack_fffffffffffffc20 != (ParserState *)0x0) {
    yylex_destroy(in_stack_fffffffffffffc20);
  }
  if ((local_78 & 1) != 0) {
    abort();
  }
  ParserState::~ParserState(this);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void solve(std::istream& is, std::ostream& err) {
        std::string s = std::string(std::istreambuf_iterator<char>(is),
                               std::istreambuf_iterator<char>());

        ParserState pp(s, err);
        yylex_init(&pp.yyscanner);
        yyset_extra(&pp, pp.yyscanner);
        // yydebug = 1;
        yyparse(&pp);
        FlatZinc::s->output = pp.getOutput();
        FlatZinc::s->setOutput();

        if (pp.yyscanner)
            yylex_destroy(pp.yyscanner);
        if (pp.hadError) abort();
    }